

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseNode_Mesh(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  CAMFImporter_NodeElement *pNode;
  undefined8 extraout_RAX;
  allocator<char> local_7e;
  allocator<char> local_7d;
  uint local_7c;
  CAMFImporter_NodeElement *ne;
  string local_70;
  string local_50;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x50);
  CAMFImporter_NodeElement_Mesh::CAMFImporter_NodeElement_Mesh
            ((CAMFImporter_NodeElement_Mesh *)pNode,this->mNodeElement_Cur);
  ne = pNode;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    local_7c = 0;
    do {
      do {
        while( true ) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"mesh",(allocator<char> *)&local_50);
            Throw_CloseNotFound(this,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_003c637a;
          }
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"vertices",(allocator<char> *)&local_50);
          bVar1 = XML_CheckNode_NameEqual(this,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar1) {
            if ((local_7c & 1) != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"vertices",&local_7d);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"Only one vertices set can be defined for <mesh>.",
                         &local_7e);
              Throw_MoreThanOnceDefined(this,&local_70,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
            }
            ParseNode_Vertices(this);
            local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"volume",(allocator<char> *)&local_50);
            bVar1 = XML_CheckNode_NameEqual(this,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (bVar1) {
              ParseNode_Volume(this);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"mesh",(allocator<char> *)&local_50);
              XML_CheckNode_SkipUnsupported(this,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"mesh",(allocator<char> *)&local_50);
      bVar1 = XML_CheckNode_NameEqual(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    } while (!bVar1);
LAB_003c637a:
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&ne);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Mesh()
{
CAMFImporter_NodeElement* ne;

	// create new mesh object.
	ne = new CAMFImporter_NodeElement_Mesh(mNodeElement_Cur);
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool vert_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("mesh");
			if(XML_CheckNode_NameEqual("vertices"))
			{
				// Check if data already defined.
				if(vert_read) Throw_MoreThanOnceDefined("vertices", "Only one vertices set can be defined for <mesh>.");
				// read data and set flag about it
				ParseNode_Vertices();
				vert_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("volume")) { ParseNode_Volume(); continue; }
		MACRO_NODECHECK_LOOPEND("mesh");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}